

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::Stream::write_format<int,char_const*>(Stream *this,char *fmt,int *args,char **args_1)

{
  int iVar1;
  pointer pvVar2;
  size_type sVar3;
  ulong uVar4;
  vector<char,_std::allocator<char>_> *this_00;
  reference pvVar5;
  undefined8 *in_RCX;
  uint *in_RDX;
  char *in_RSI;
  long *in_RDI;
  vector<char,_std::allocator<char>_> glowable_buf;
  size_t n;
  int sn;
  array<char,_2048UL> buf;
  int bufsiz;
  allocator_type *in_stack_fffffffffffff760;
  size_type in_stack_fffffffffffff768;
  allocator<char> local_851;
  vector<char,_std::allocator<char>_> local_850;
  ulong local_838;
  int local_830;
  array<char,_2048UL> local_82c;
  undefined4 local_2c;
  undefined8 *local_28;
  uint *local_20;
  char *local_18;
  long local_8;
  
  local_2c = 0x800;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  memset(&local_82c,0,0x800);
  pvVar2 = std::array<char,_2048UL>::data((array<char,_2048UL> *)0x1a25d0);
  sVar3 = std::array<char,_2048UL>::size(&local_82c);
  local_830 = snprintf(pvVar2,sVar3 - 1,local_18,(ulong)*local_20,*local_28);
  if (local_830 < 1) {
    local_8 = (long)local_830;
  }
  else {
    uVar4 = (ulong)local_830;
    local_838 = uVar4;
    sVar3 = std::array<char,_2048UL>::size(&local_82c);
    if (uVar4 < sVar3 - 1) {
      pvVar2 = std::array<char,_2048UL>::data((array<char,_2048UL> *)0x1a27ef);
      local_8 = (**(code **)(*in_RDI + 0x28))(in_RDI,pvVar2,local_838);
    }
    else {
      this_00 = (vector<char,_std::allocator<char>_> *)std::array<char,_2048UL>::size(&local_82c);
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                (this_00,in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      std::allocator<char>::~allocator(&local_851);
      while( true ) {
        uVar4 = local_838;
        sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_850);
        if (uVar4 < sVar3 - 1) break;
        in_stack_fffffffffffff760 = (allocator_type *)&local_850;
        std::vector<char,_std::allocator<char>_>::size
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff760);
        std::vector<char,_std::allocator<char>_>::resize(this_00,uVar4);
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&local_850,0);
        sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_850);
        iVar1 = snprintf(pvVar5,sVar3 - 1,local_18,(ulong)*local_20,*local_28);
        local_838 = (ulong)iVar1;
      }
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&local_850,0);
      local_8 = (**(code **)(*in_RDI + 0x28))(in_RDI,pvVar5,local_838);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff760);
    }
  }
  return local_8;
}

Assistant:

inline ssize_t Stream::write_format(const char *fmt, const Args &...args) {
  const auto bufsiz = 2048;
  std::array<char, bufsiz> buf{};

  auto sn = snprintf(buf.data(), buf.size() - 1, fmt, args...);
  if (sn <= 0) { return sn; }

  auto n = static_cast<size_t>(sn);

  if (n >= buf.size() - 1) {
    std::vector<char> glowable_buf(buf.size());

    while (n >= glowable_buf.size() - 1) {
      glowable_buf.resize(glowable_buf.size() * 2);
      n = static_cast<size_t>(
          snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...));
    }
    return write(&glowable_buf[0], n);
  } else {
    return write(buf.data(), n);
  }
}